

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O1

Pattern * __thiscall
compile_template<AST::DirectionAlternation>::operator()
          (compile_template<AST::DirectionAlternation> *this,Pattern *p)

{
  Pattern *pPVar1;
  vector<Direction,_std::allocator<Direction>_> local_28;
  
  pPVar1 = (Pattern *)operator_new(0x20);
  std::vector<Direction,_std::allocator<Direction>_>::vector
            (&local_28,(vector<Direction,_std::allocator<Direction>_> *)(p + 1));
  *(undefined4 *)pPVar1 = 7;
  std::vector<Direction,_std::allocator<Direction>_>::vector
            ((vector<Direction,_std::allocator<Direction>_> *)(pPVar1 + 8),&local_28);
  if (local_28.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pPVar1;
}

Assistant:

Pattern* operator()(AST::Pattern* p) {
        return compile((PClass*)p);
    }